

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O2

Dar_Lib_t * Dar_LibRead(void)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *p;
  Vec_Int_t *vOuts;
  Vec_Int_t *vPrios;
  Dar_Lib_t *p_00;
  long lVar3;
  
  p = Dar_LibReadNodes();
  vOuts = Dar_LibReadOuts();
  vPrios = Dar_LibReadPrios();
  p_00 = Dar_LibAlloc(p->nSize / 2 + 4);
  for (lVar3 = 0; lVar3 < p->nSize; lVar3 = lVar3 + 2) {
    uVar1 = p->pArray[lVar3];
    uVar2 = p->pArray[lVar3 + 1];
    Dar_LibAddNode(p_00,(int)uVar1 >> 1,(int)uVar2 >> 1,uVar1 & 1,uVar2 & 1);
  }
  Dar_LibSetup(p_00,vOuts,vPrios);
  Vec_IntFree(p);
  Vec_IntFree(vOuts);
  Vec_IntFree(vPrios);
  return p_00;
}

Assistant:

Dar_Lib_t * Dar_LibRead()
{
    Vec_Int_t * vObjs, * vOuts, * vPrios;
    Dar_Lib_t * p;
    int i;
    // read nodes and outputs
    vObjs  = Dar_LibReadNodes();
    vOuts  = Dar_LibReadOuts();
    vPrios = Dar_LibReadPrios();
    // create library
    p = Dar_LibAlloc( Vec_IntSize(vObjs)/2 + 4 );
    // create nodes
    for ( i = 0; i < vObjs->nSize; i += 2 )
        Dar_LibAddNode( p, vObjs->pArray[i] >> 1, vObjs->pArray[i+1] >> 1,
            vObjs->pArray[i] & 1, vObjs->pArray[i+1] & 1 );
    // create outputs
    Dar_LibSetup( p, vOuts, vPrios );
    Vec_IntFree( vObjs );
    Vec_IntFree( vOuts );
    Vec_IntFree( vPrios );
    return p;
}